

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

void amrex::Copy<amrex::TagBox,void>
               (FabArray<amrex::TagBox> *dst,FabArray<amrex::TagBox> *src,int srccomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Array4<char> dstFab;
  Array4<const_char> srcFab;
  MFIter mfi;
  Box local_16c;
  ulong local_150;
  int local_144;
  IntVect *local_140;
  FabArray<amrex::TagBox> *local_138;
  FabArray<amrex::TagBox> *local_130;
  long local_128;
  long local_120;
  ulong local_118;
  Array4<char> local_110;
  Array4<const_char> local_d0;
  MFIter local_90;
  
  local_138 = dst;
  local_130 = src;
  MFIter::MFIter(&local_90,&dst->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_120 = (long)srccomp;
    local_128 = (long)dstcomp;
    local_118 = (ulong)(uint)numcomp;
    local_140 = nghost;
    do {
      MFIter::growntilebox(&local_16c,&local_90,nghost);
      if ((((local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) &&
           (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1])) &&
          (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2])) && (local_16c.btype.itype < 8))
      {
        FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&local_d0,local_130,&local_90);
        FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&local_110,local_138,&local_90);
        nghost = local_140;
        if (0 < numcomp) {
          local_144 = local_16c.smallend.vect[1];
          local_150 = 0;
          do {
            if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
              iVar2 = local_16c.smallend.vect[2];
              do {
                iVar3 = local_16c.smallend.vect[1];
                if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                  do {
                    iVar1 = local_16c.smallend.vect[0];
                    if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                      do {
                        local_110.p
                        [local_110.nstride * (local_150 + local_128) +
                         ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride +
                         (long)(iVar1 - local_110.begin.x) +
                         ((long)iVar3 - (long)local_110.begin.y) * local_110.jstride] =
                             local_d0.p
                             [local_d0.nstride * (local_150 + local_120) +
                              ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride +
                              (long)(iVar1 - local_d0.begin.x) +
                              ((long)iVar3 - (long)local_d0.begin.y) * local_d0.jstride];
                        iVar1 = iVar1 + 1;
                      } while (local_16c.bigend.vect[0] + 1 != iVar1);
                    }
                    bVar4 = iVar3 != local_16c.bigend.vect[1];
                    iVar3 = iVar3 + 1;
                  } while (bVar4);
                }
                bVar4 = iVar2 != local_16c.bigend.vect[2];
                iVar2 = iVar2 + 1;
              } while (bVar4);
            }
            local_150 = local_150 + 1;
          } while (local_150 != local_118);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}